

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::resize(CImgDisplay *this,int nwidth,int nheight,bool force_redraw)

{
  uint uVar1;
  Display *pDVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  X11_static *pXVar6;
  uint local_f8;
  uint local_f4;
  uint local_ec;
  uint local_e4;
  uint pixel_type_2;
  unsigned_short pixel_type_1;
  uchar pixel_type;
  uint i;
  XWindowAttributes attr;
  uint dimy;
  uint dimx;
  uint tmpdimy;
  uint tmpdimx;
  Display *dpy;
  bool force_redraw_local;
  int nheight_local;
  int nwidth_local;
  CImgDisplay *this_local;
  
  if (((nwidth == 0) || (nheight == 0)) ||
     ((bVar3 = is_empty(this), bVar3 && ((nwidth < 0 || (nheight < 0)))))) {
    this_local = assign(this);
  }
  else {
    bVar3 = is_empty(this);
    if (bVar3) {
      this_local = assign(this,nwidth,nheight,(char *)0x0,3,false,false);
    }
    else {
      pXVar6 = cimg::X11_attr();
      pDVar2 = pXVar6->display;
      local_e4 = nwidth;
      if (nwidth < 1) {
        iVar4 = width(this);
        local_e4 = (-nwidth * iVar4) / 100;
      }
      local_ec = nheight;
      if (nheight < 1) {
        iVar4 = height(this);
        local_ec = (-nheight * iVar4) / 100;
      }
      if (local_e4 == 0) {
        local_f4 = 1;
      }
      else {
        local_f4 = local_e4;
      }
      attr.screen._4_4_ = local_f4;
      if (local_ec == 0) {
        local_f8 = 1;
      }
      else {
        local_f8 = local_ec;
      }
      attr.screen._0_4_ = local_f8;
      if ((((this->_width != local_f4) || (this->_height != local_f8)) ||
          (this->_window_width != local_f4)) || (this->_window_height != local_f8)) {
        show(this);
        cimg::mutex(0xf,1);
        if ((this->_window_width != attr.screen._4_4_) ||
           (this->_window_height != (uint)attr.screen)) {
          for (pixel_type_2 = 0; pixel_type_2 < 10; pixel_type_2 = pixel_type_2 + 1) {
            XResizeWindow(pDVar2,this->_window,attr.screen._4_4_,(uint)attr.screen);
            XGetWindowAttributes(pDVar2,this->_window,&pixel_type_1);
            if ((attr.x == attr.screen._4_4_) && (attr.y == (uint)attr.screen)) break;
            cimg::wait((cimg *)0x5,this);
          }
        }
        if ((this->_width != attr.screen._4_4_) || (this->_height != (uint)attr.screen)) {
          pXVar6 = cimg::X11_attr();
          if (pXVar6->nb_bits == 8) {
            _resize<unsigned_char>(this,'\0',attr.screen._4_4_,(uint)attr.screen,force_redraw);
          }
          else if (pXVar6->nb_bits == 0x10) {
            _resize<unsigned_short>(this,0,attr.screen._4_4_,(uint)attr.screen,force_redraw);
          }
          else {
            _resize<unsigned_int>(this,0,attr.screen._4_4_,(uint)attr.screen,force_redraw);
          }
        }
        this->_width = attr.screen._4_4_;
        this->_window_width = attr.screen._4_4_;
        this->_height = (uint)attr.screen;
        this->_window_height = (uint)attr.screen;
        cimg::mutex(0xf,0);
      }
      this->_is_resized = false;
      if ((this->_is_fullscreen & 1U) != 0) {
        iVar4 = screen_width();
        uVar1 = this->_width;
        iVar5 = screen_height();
        move(this,iVar4 - uVar1 >> 1,iVar5 - this->_height >> 1);
      }
      this_local = this;
      if (force_redraw) {
        this_local = paint(this,true);
      }
    }
  }
  return this_local;
}

Assistant:

CImgDisplay& resize(const int nwidth, const int nheight, const bool force_redraw=true) {
      if (!nwidth || !nheight || (is_empty() && (nwidth<0 || nheight<0))) return assign();
      if (is_empty()) return assign(nwidth,nheight);
      Display *const dpy = cimg::X11_attr().display;
      const unsigned int
        tmpdimx = (nwidth>0)?nwidth:(-nwidth*width()/100),
        tmpdimy = (nheight>0)?nheight:(-nheight*height()/100),
        dimx = tmpdimx?tmpdimx:1,
        dimy = tmpdimy?tmpdimy:1;
      if (_width!=dimx || _height!=dimy || _window_width!=dimx || _window_height!=dimy) {
        show();
        cimg_lock_display();
        if (_window_width!=dimx || _window_height!=dimy) {
          XWindowAttributes attr;
          for (unsigned int i = 0; i<10; ++i) {
            XResizeWindow(dpy,_window,dimx,dimy);
            XGetWindowAttributes(dpy,_window,&attr);
            if (attr.width==(int)dimx && attr.height==(int)dimy) break;
            cimg::wait(5,&_timer);
          }
        }
        if (_width!=dimx || _height!=dimy) switch (cimg::X11_attr().nb_bits) {
          case 8 :  { unsigned char pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); } break;
          case 16 : { unsigned short pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); } break;
          default : { unsigned int pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); }
          }
        _window_width = _width = dimx; _window_height = _height = dimy;
        cimg_unlock_display();
      }
      _is_resized = false;
      if (_is_fullscreen) move((screen_width() - _width)/2,(screen_height() - _height)/2);
      if (force_redraw) return paint();
      return *this;
    }